

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cCMYK,cBGRA,bModulate>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  EBlend EVar2;
  FSpecialColormap *pFVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  byte *pbVar7;
  int iVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  
  pFVar3 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_00649573_caseD_0:
    if (0 < count) {
      pbVar7 = pin + 3;
      lVar4 = 0;
      do {
        pout[lVar4 * 4 + 2] =
             (BYTE)(((uint)pout[lVar4 * 4 + 2] *
                    (uint)(byte)(*pbVar7 - (char)((0x100 - (uint)pbVar7[-3]) * (uint)*pbVar7 >> 8)))
                   / 0xff);
        pout[lVar4 * 4 + 1] =
             (BYTE)(((uint)pout[lVar4 * 4 + 1] *
                    (uint)(byte)(*pbVar7 - (char)((0x100 - (uint)pbVar7[-2]) * (uint)*pbVar7 >> 8)))
                   / 0xff);
        pout[lVar4 * 4] =
             (BYTE)(((uint)pout[lVar4 * 4] *
                    (uint)(byte)(*pbVar7 - (char)((0x100 - (uint)pbVar7[-1]) * (uint)*pbVar7 >> 8)))
                   / 0xff);
        pout[lVar4 * 4 + 3] = 0xff;
        lVar4 = lVar4 + 1;
        pbVar7 = pbVar7 + step;
      } while (count != (int)lVar4);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_00649573_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        pbVar7 = pin + 3;
        lVar4 = 0;
        do {
          bVar5 = *pbVar7;
          bVar10 = bVar5 - (char)((0x100 - (uint)pbVar7[-1]) * (uint)bVar5 >> 8);
          uVar11 = (uint)(byte)(bVar5 - (char)((0x100 - (uint)pbVar7[-2]) * (uint)bVar5 >> 8)) *
                   0x8f + (uint)(byte)(bVar5 - (char)((0x100 - (uint)pbVar7[-3]) * (uint)bVar5 >> 8)
                                      ) * 0x4d + ((uint)bVar10 + (uint)bVar10 * 8) * 4 >> 0xc;
          pout[lVar4 * 4 + 2] =
               (BYTE)(((uint)pout[lVar4 * 4 + 2] * (uint)IcePalette[uVar11][0]) / 0xff);
          pout[lVar4 * 4 + 1] =
               (BYTE)(((uint)pout[lVar4 * 4 + 1] * (uint)IcePalette[uVar11][1]) / 0xff);
          pout[lVar4 * 4] = (BYTE)(((uint)pout[lVar4 * 4] * (uint)IcePalette[uVar11][2]) / 0xff);
          pout[lVar4 * 4 + 3] = 0xff;
          lVar4 = lVar4 + 1;
          pbVar7 = pbVar7 + step;
        } while (count != (int)lVar4);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        pbVar7 = pin + 3;
        lVar4 = 0;
        do {
          bVar5 = *pbVar7;
          iVar8 = inf->blendcolor[3];
          bVar10 = pbVar7[-2];
          iVar15 = inf->blendcolor[1];
          bVar1 = pbVar7[-1];
          iVar6 = inf->blendcolor[2];
          pout[lVar4 * 4 + 2] =
               (BYTE)(((uint)pout[lVar4 * 4 + 2] *
                      ((uint)(byte)(bVar5 - (char)((0x100 - (uint)pbVar7[-3]) * (uint)bVar5 >> 8)) *
                       iVar8 + inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
          pout[lVar4 * 4 + 1] =
               (BYTE)(((uint)pout[lVar4 * 4 + 1] *
                      ((uint)(byte)(bVar5 - (char)((0x100 - (uint)bVar10) * (uint)bVar5 >> 8)) *
                       iVar8 + iVar15 >> 0x10 & 0xff)) / 0xff);
          pout[lVar4 * 4] =
               (BYTE)(((uint)pout[lVar4 * 4] *
                      ((uint)(byte)(bVar5 - (char)((0x100 - (uint)bVar1) * (uint)bVar5 >> 8)) *
                       iVar8 + iVar6 >> 0x10 & 0xff)) / 0xff);
          pout[lVar4 * 4 + 3] = 0xff;
          lVar4 = lVar4 + 1;
          pbVar7 = pbVar7 + step;
        } while (count != (int)lVar4);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        pbVar7 = pin + 3;
        lVar4 = 0;
        do {
          bVar5 = *pbVar7;
          bVar10 = pbVar7[-2];
          iVar8 = inf->blendcolor[1];
          bVar1 = pbVar7[-1];
          iVar15 = inf->blendcolor[2];
          pout[lVar4 * 4 + 2] =
               (BYTE)(((uint)pout[lVar4 * 4 + 2] *
                      ((uint)(byte)(bVar5 - (char)((0x100 - (uint)pbVar7[-3]) * (uint)bVar5 >> 8)) *
                       inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
          pout[lVar4 * 4 + 1] =
               (BYTE)(((uint)pout[lVar4 * 4 + 1] *
                      ((uint)(byte)(bVar5 - (char)((0x100 - (uint)bVar10) * (uint)bVar5 >> 8)) *
                       iVar8 >> 0x10 & 0xff)) / 0xff);
          pout[lVar4 * 4] =
               (BYTE)(((uint)pout[lVar4 * 4] *
                      ((uint)(byte)(bVar5 - (char)((0x100 - (uint)bVar1) * (uint)bVar5 >> 8)) *
                       iVar15 >> 0x10 & 0xff)) / 0xff);
          pout[lVar4 * 4 + 3] = 0xff;
          lVar4 = lVar4 + 1;
          pbVar7 = pbVar7 + step;
        } while (count != (int)lVar4);
      }
      break;
    default:
      EVar2 = inf->blend;
      lVar4 = (long)EVar2;
      if (lVar4 < 0x21) {
        if ((BLEND_ICEMAP < EVar2) && (0 < count)) {
          iVar8 = 0x20 - EVar2;
          pbVar7 = pin + 3;
          lVar4 = 0;
          do {
            bVar5 = *pbVar7;
            uVar13 = (uint)(byte)(bVar5 - (char)((0x100 - (uint)pbVar7[-3]) * (uint)bVar5 >> 8));
            uVar11 = (uint)(byte)(bVar5 - (char)((0x100 - (uint)pbVar7[-2]) * (uint)bVar5 >> 8));
            bVar5 = bVar5 - (char)((0x100 - (uint)pbVar7[-1]) * (uint)bVar5 >> 8);
            iVar15 = (uVar11 * 0x8f + uVar13 * 0x4d + ((uint)bVar5 + (uint)bVar5 * 8) * 4 >> 8) *
                     (EVar2 + BLEND_MODULATE);
            iVar14 = uVar13 * iVar8 + iVar15;
            iVar6 = uVar11 * iVar8 + iVar15;
            iVar15 = (uint)bVar5 * iVar8 + iVar15;
            pout[lVar4 * 4 + 2] =
                 (BYTE)(((uint)pout[lVar4 * 4 + 2] *
                        ((uint)((ulong)((long)iVar14 * 0x84210843) >> 0x24) - (iVar14 >> 0x1f) &
                        0xff)) / 0xff);
            pout[lVar4 * 4 + 1] =
                 (BYTE)(((uint)pout[lVar4 * 4 + 1] *
                        ((uint)((ulong)((long)iVar6 * 0x84210843) >> 0x24) - (iVar6 >> 0x1f) & 0xff)
                        ) / 0xff);
            pout[lVar4 * 4] =
                 (BYTE)(((uint)pout[lVar4 * 4] *
                        ((uint)((ulong)((long)iVar15 * 0x84210843) >> 0x24) - (iVar15 >> 0x1f) &
                        0xff)) / 0xff);
            pout[lVar4 * 4 + 3] = 0xff;
            lVar4 = lVar4 + 1;
            pbVar7 = pbVar7 + step;
          } while (count != (int)lVar4);
        }
      }
      else if (0 < count) {
        pbVar7 = pin + 3;
        lVar9 = 0;
        do {
          bVar5 = *pbVar7;
          bVar10 = bVar5 - (char)((0x100 - (uint)pbVar7[-1]) * (uint)bVar5 >> 8);
          uVar12 = (ulong)((uint)(byte)(bVar5 - (char)((0x100 - (uint)pbVar7[-2]) * (uint)bVar5 >> 8
                                                      )) * 0x8f +
                           (uint)(byte)(bVar5 - (char)((0x100 - (uint)pbVar7[-3]) * (uint)bVar5 >> 8
                                                      )) * 0x4d +
                           ((uint)bVar10 + (uint)bVar10 * 8) * 4 >> 8);
          bVar5 = *(byte *)((long)pFVar3 + uVar12 * 4 + lVar4 * 0x518 + -0xa700);
          bVar10 = *(byte *)((long)pFVar3 + uVar12 * 4 + lVar4 * 0x518 + -0xa6ff);
          pout[lVar9 * 4 + 2] =
               (BYTE)(((uint)pout[lVar9 * 4 + 2] *
                      (uint)*(byte *)((long)pFVar3 + uVar12 * 4 + lVar4 * 0x518 + -0xa6fe)) / 0xff);
          pout[lVar9 * 4 + 1] = (BYTE)(((uint)pout[lVar9 * 4 + 1] * (uint)bVar10) / 0xff);
          pout[lVar9 * 4] = (BYTE)(((uint)pout[lVar9 * 4] * (uint)bVar5) / 0xff);
          pout[lVar9 * 4 + 3] = 0xff;
          lVar9 = lVar9 + 1;
          pbVar7 = pbVar7 + step;
        } while (count != (int)lVar9);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}